

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

void __thiscall Assimp::IFCImporter::SetupProperties(IFCImporter *this,Importer *pImp)

{
  bool bVar1;
  float *pfVar2;
  int *piVar3;
  int local_30 [3];
  float local_24;
  float local_20;
  ai_real local_1c;
  Importer *local_18;
  Importer *pImp_local;
  IFCImporter *this_local;
  
  local_18 = pImp;
  pImp_local = (Importer *)this;
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_IFC_SKIP_SPACE_REPRESENTATIONS",true);
  (this->settings).skipSpaceRepresentations = bVar1;
  bVar1 = Importer::GetPropertyBool(local_18,"IMPORT_IFC_CUSTOM_TRIANGULATION",true);
  (this->settings).useCustomTriangulation = bVar1;
  local_1c = Importer::GetPropertyFloat(local_18,"IMPORT_IFC_SMOOTHING_ANGLE",10.0);
  local_20 = 5.0;
  pfVar2 = std::max<float>(&local_1c,&local_20);
  local_24 = 120.0;
  pfVar2 = std::min<float>(pfVar2,&local_24);
  (this->settings).conicSamplingAngle = *pfVar2;
  local_30[2] = Importer::GetPropertyInteger(local_18,"IMPORT_IFC_CYLINDRICAL_TESSELLATION",0x20);
  local_30[1] = 3;
  piVar3 = std::max<int>(local_30 + 2,local_30 + 1);
  local_30[0] = 0xb4;
  piVar3 = std::min<int>(piVar3,local_30);
  (this->settings).cylindricalTessellation = *piVar3;
  (this->settings).skipAnnotations = true;
  return;
}

Assistant:

void IFCImporter::SetupProperties(const Importer* pImp)
{
    settings.skipSpaceRepresentations = pImp->GetPropertyBool(AI_CONFIG_IMPORT_IFC_SKIP_SPACE_REPRESENTATIONS,true);
    settings.useCustomTriangulation = pImp->GetPropertyBool(AI_CONFIG_IMPORT_IFC_CUSTOM_TRIANGULATION,true);
    settings.conicSamplingAngle = std::min(std::max((float) pImp->GetPropertyFloat(AI_CONFIG_IMPORT_IFC_SMOOTHING_ANGLE, AI_IMPORT_IFC_DEFAULT_SMOOTHING_ANGLE), 5.0f), 120.0f);
	settings.cylindricalTessellation = std::min(std::max(pImp->GetPropertyInteger(AI_CONFIG_IMPORT_IFC_CYLINDRICAL_TESSELLATION, AI_IMPORT_IFC_DEFAULT_CYLINDRICAL_TESSELLATION), 3), 180);
	settings.skipAnnotations = true;
}